

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# locgen.cpp
# Opt level: O3

void set_top_offset_proc(Am_Object *cmd)

{
  int iVar1;
  Am_Value *pAVar2;
  Am_Ptr pvVar3;
  Am_Object win;
  Am_Object AStack_18;
  Am_Object local_10;
  
  Am_Object::Get_Object(&AStack_18,(Am_Slot_Key)cmd,0x170);
  Am_Object::Get_Object(&local_10,(Am_Slot_Key)&AStack_18,10);
  Am_Object::~Am_Object(&AStack_18);
  pAVar2 = Am_Object::Get(&local_10,0xfa,0);
  pvVar3 = Am_Value::operator_cast_to_void_(pAVar2);
  Am_Object::Get_Object(&AStack_18,(Am_Slot_Key)&local_10,(ulong)Am_TOP_HOW);
  pAVar2 = Am_Object::Get(&AStack_18,0x169,0);
  iVar1 = Am_Value::operator_cast_to_int(pAVar2);
  *(int *)((long)pvVar3 + 4) = iVar1;
  Am_Object::~Am_Object(&AStack_18);
  iVar1 = *(int *)((long)pvVar3 + 0x24);
  Am_Object::Get_Object(&AStack_18,(Am_Slot_Key)&local_10,(ulong)Am_TOP_AMOUNT_WIDGET);
  Am_Object::Set(&AStack_18,0x169,iVar1,0);
  Am_Object::~Am_Object(&AStack_18);
  set_ref_grey(&local_10,true);
  Am_Object::~Am_Object(&local_10);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, set_top_offset, (Am_Object cmd))
{
  Am_Object win = cmd.Get_Object(Am_SAVED_OLD_OWNER).Get_Owner();
  am_loc_values *loc_values = (am_loc_values *)(Am_Ptr)win.Get(Am_VALUES);
  loc_values->top_control = win.Get_Object(Am_TOP_HOW).Get(Am_VALUE);
  int val = loc_values->top_offset;
  win.Get_Object(Am_TOP_AMOUNT_WIDGET).Set(Am_VALUE, val);
  set_ref_grey(win, true);
}